

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O2

_Bool Open_JTalk_generate_sounddata
                (Open_JTalk *open_jtalk,char *txt,short **sounddata,size_t *size,
                size_t *sampling_frequency)

{
  NJD *njd;
  JPCommon *jpcommon;
  double dVar1;
  ulong uVar2;
  HTS_Boolean HVar3;
  int iVar4;
  char **ppcVar5;
  short *psVar6;
  short sVar7;
  size_t __nmemb;
  _Bool _Var8;
  uint i;
  ulong uVar9;
  char buff [1024];
  
  if (open_jtalk == (Open_JTalk *)0x0) {
    _Var8 = false;
  }
  else {
    text2mecab(buff,txt);
    Mecab_analysis(&open_jtalk->mecab,buff);
    njd = &open_jtalk->njd;
    ppcVar5 = Mecab_get_feature(&open_jtalk->mecab);
    iVar4 = Mecab_get_size(&open_jtalk->mecab);
    mecab2njd(njd,ppcVar5,iVar4);
    njd_set_pronunciation(njd);
    njd_set_digit(njd);
    njd_set_accent_phrase(njd);
    njd_set_accent_type(njd);
    njd_set_unvoiced_vowel(njd);
    njd_set_long_vowel(njd);
    jpcommon = &open_jtalk->jpcommon;
    njd2jpcommon(jpcommon,njd);
    JPCommon_make_label(jpcommon);
    iVar4 = JPCommon_get_label_size(jpcommon);
    if (iVar4 < 3) {
      uVar9 = 0;
    }
    else {
      ppcVar5 = JPCommon_get_label_feature(jpcommon);
      iVar4 = JPCommon_get_label_size(jpcommon);
      HVar3 = HTS_Engine_synthesize_from_strings(&open_jtalk->engine,ppcVar5,(long)iVar4);
      uVar9 = 0;
      if (HVar3 == '\x01') {
        uVar2 = (open_jtalk->engine).gss.total_nsample;
        __nmemb = (uVar2 & 0xfffffffffffffc00) + 0x400;
        psVar6 = (short *)calloc(__nmemb,2);
        for (; uVar9 < uVar2; uVar9 = (ulong)((int)uVar9 + 1)) {
          dVar1 = (open_jtalk->engine).gss.gspeech[uVar9];
          sVar7 = 0x7fff;
          if ((dVar1 <= 32767.0) && (sVar7 = -0x8000, -32768.0 <= dVar1)) {
            sVar7 = (short)(int)dVar1;
          }
          psVar6[uVar9] = sVar7;
        }
        if (__nmemb - uVar2 != 0) {
          memset(psVar6 + uVar2,0,__nmemb - uVar2);
        }
        *sounddata = psVar6;
        *size = __nmemb;
        *sampling_frequency = (open_jtalk->engine).condition.sampling_frequency;
        uVar9 = 1;
      }
    }
    _Var8 = SUB81(uVar9,0);
    Open_JTalk_refresh(open_jtalk);
  }
  return _Var8;
}

Assistant:

bool Open_JTalk_generate_sounddata(Open_JTalk *open_jtalk,
								   const char *txt,
								   short **sounddata,
								   size_t *size,
								   size_t *sampling_frequency)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	char buff[MAXBUFLEN];
	text2mecab(buff, txt);
	Mecab_analysis(&open_jtalk->mecab, buff);
	mecab2njd(&open_jtalk->njd, Mecab_get_feature(&open_jtalk->mecab),
			  Mecab_get_size(&open_jtalk->mecab));
	njd_set_pronunciation(&open_jtalk->njd);
	njd_set_digit(&open_jtalk->njd);
	njd_set_accent_phrase(&open_jtalk->njd);
	njd_set_accent_type(&open_jtalk->njd);
	njd_set_unvoiced_vowel(&open_jtalk->njd);
	njd_set_long_vowel(&open_jtalk->njd);
	njd2jpcommon(&open_jtalk->jpcommon, &open_jtalk->njd);
	JPCommon_make_label(&open_jtalk->jpcommon);
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		if (HTS_Engine_synthesize_from_strings(
				&open_jtalk->engine,
				JPCommon_get_label_feature(&open_jtalk->jpcommon), JPCommon_get_label_size(&open_jtalk->jpcommon)) == TRUE)
		{
			short temp;
			HTS_GStreamSet *gss = &open_jtalk->engine.gss;
			size_t len = (gss->total_nsample / OPEN_JTALK_BLOCKSIZE + 1) * OPEN_JTALK_BLOCKSIZE;
			short *data = (short *)calloc(len, sizeof(short));
			for (unsigned int i = 0; i < gss->total_nsample; i++)
			{
				double x = gss->gspeech[i];
				if (x > 32767.0)
				{
					temp = 32767;
				}
				else if (x < -32768.0)
				{
					temp = -32768;
				}
				else
				{
					temp = (short)x;
				}
				data[i] = temp;
			}
			if (len != gss->total_nsample)
			{
				memset(data + gss->total_nsample, '\0', len - gss->total_nsample);
			}
			*sounddata = data;
			*size = len;
			*sampling_frequency = (&open_jtalk->engine)->condition.sampling_frequency;
			Open_JTalk_refresh(open_jtalk);
			return true;
		}
	}
	Open_JTalk_refresh(open_jtalk);
	return false;
}